

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void handleEvents(double *timeout)

{
  int iVar1;
  GLFWbool GVar2;
  double *in_RDI;
  nfds_t unaff_retaddr;
  pollfd *in_stack_00000008;
  uint64_t repeats_1;
  uint64_t i;
  uint64_t repeats;
  _GLFWwindow *window;
  pollfd fds [4];
  GLFWbool event;
  _GLFWwindow *p_Var3;
  
  if (_glfw.joysticksInitialized != 0) {
    _glfwDetectJoystickConnectionLinux();
  }
  (*_glfw.wl.client.display_get_fd)(_glfw.wl.display);
  if (_glfw.wl.libdecor.context != (libdecor *)0x0) {
    (*_glfw.wl.libdecor.libdecor_get_fd_)(_glfw.wl.libdecor.context);
  }
  while( true ) {
    while (iVar1 = (*_glfw.wl.client.display_prepare_read)(_glfw.wl.display), iVar1 != 0) {
      iVar1 = (*_glfw.wl.client.display_dispatch_pending)(_glfw.wl.display);
      if (0 < iVar1) {
        return;
      }
    }
    GVar2 = flushDisplay();
    if (GVar2 == 0) {
      (*_glfw.wl.client.display_cancel_read)(_glfw.wl.display);
      for (p_Var3 = _glfw.windowListHead; p_Var3 != (_GLFWwindow *)0x0; p_Var3 = p_Var3->next) {
        _glfwInputWindowCloseRequest((_GLFWwindow *)0x9e1dbe);
      }
      return;
    }
    GVar2 = _glfwPollPOSIX(in_stack_00000008,unaff_retaddr,in_RDI);
    if (GVar2 == 0) break;
    (*_glfw.wl.client.display_cancel_read)(_glfw.wl.display);
  }
  (*_glfw.wl.client.display_cancel_read)(_glfw.wl.display);
  return;
}

Assistant:

static void handleEvents(double* timeout)
{
#if defined(GLFW_BUILD_LINUX_JOYSTICK)
    if (_glfw.joysticksInitialized)
        _glfwDetectJoystickConnectionLinux();
#endif

    GLFWbool event = GLFW_FALSE;
    enum { DISPLAY_FD, KEYREPEAT_FD, CURSOR_FD, LIBDECOR_FD };
    struct pollfd fds[] =
    {
        [DISPLAY_FD] = { wl_display_get_fd(_glfw.wl.display), POLLIN },
        [KEYREPEAT_FD] = { _glfw.wl.keyRepeatTimerfd, POLLIN },
        [CURSOR_FD] = { _glfw.wl.cursorTimerfd, POLLIN },
        [LIBDECOR_FD] = { -1, POLLIN }
    };

    if (_glfw.wl.libdecor.context)
        fds[LIBDECOR_FD].fd = libdecor_get_fd(_glfw.wl.libdecor.context);

    while (!event)
    {
        while (wl_display_prepare_read(_glfw.wl.display) != 0)
        {
            if (wl_display_dispatch_pending(_glfw.wl.display) > 0)
                return;
        }

        // If an error other than EAGAIN happens, we have likely been disconnected
        // from the Wayland session; try to handle that the best we can.
        if (!flushDisplay())
        {
            wl_display_cancel_read(_glfw.wl.display);

            _GLFWwindow* window = _glfw.windowListHead;
            while (window)
            {
                _glfwInputWindowCloseRequest(window);
                window = window->next;
            }

            return;
        }

        if (!_glfwPollPOSIX(fds, sizeof(fds) / sizeof(fds[0]), timeout))
        {
            wl_display_cancel_read(_glfw.wl.display);
            return;
        }

        if (fds[DISPLAY_FD].revents & POLLIN)
        {
            wl_display_read_events(_glfw.wl.display);
            if (wl_display_dispatch_pending(_glfw.wl.display) > 0)
                event = GLFW_TRUE;
        }
        else
            wl_display_cancel_read(_glfw.wl.display);

        if (fds[KEYREPEAT_FD].revents & POLLIN)
        {
            uint64_t repeats;

            if (read(_glfw.wl.keyRepeatTimerfd, &repeats, sizeof(repeats)) == 8)
            {
                for (uint64_t i = 0; i < repeats; i++)
                {
                    _glfwInputKey(_glfw.wl.keyboardFocus,
                                  translateKey(_glfw.wl.keyRepeatScancode),
                                  _glfw.wl.keyRepeatScancode,
                                  GLFW_PRESS,
                                  _glfw.wl.xkb.modifiers);
                    inputText(_glfw.wl.keyboardFocus, _glfw.wl.keyRepeatScancode);
                }

                event = GLFW_TRUE;
            }
        }

        if (fds[CURSOR_FD].revents & POLLIN)
        {
            uint64_t repeats;

            if (read(_glfw.wl.cursorTimerfd, &repeats, sizeof(repeats)) == 8)
                incrementCursorImage(_glfw.wl.pointerFocus);
        }

        if (fds[LIBDECOR_FD].revents & POLLIN)
        {
            if (libdecor_dispatch(_glfw.wl.libdecor.context, 0) > 0)
                event = GLFW_TRUE;
        }
    }
}